

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

set<uint256,_std::less<uint256>,_std::allocator<uint256>_> * __thiscall
wallet::CWallet::GetConflicts(CWallet *this,uint256 *txid)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<uint256>,_bool> pVar4;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  CWalletTx *wtx;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *result;
  const_iterator _it;
  const_iterator __end1;
  const_iterator __begin1;
  pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  range;
  const_iterator it;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  _Rb_tree_const_iterator<uint256> in_stack_ffffffffffffff18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::_GLOBAL__N_1::std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffff18._M_node,
             (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff0c,(AnnotatedMixin<std::recursive_mutex> *)0x16fc8ec);
  std::
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  ::find((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
          *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
         (key_type *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
         *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  bVar2 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                     in_stack_ffffffffffffff18._M_node,
                     (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                     CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  if (!bVar2) {
    std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
    operator->((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    std::
    pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
    ::
    pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_true>
              ((pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
                *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::end
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    while (bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)in_stack_ffffffffffffff18._M_node,
                              (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      sVar3 = std::
              unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
              ::count((unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
                       *)in_stack_ffffffffffffff18._M_node,
                      (key_type *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
      if (1 < sVar3) {
        std::
        unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
        ::equal_range((unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
                       *)in_stack_ffffffffffffff18._M_node,
                      (key_type *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
        std::
        pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
        ::operator=((pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
                     *)in_stack_ffffffffffffff18._M_node,
                    (type)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
        while (bVar2 = std::__detail::operator==
                                 ((_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *
                                  )in_stack_ffffffffffffff18._M_node,
                                  (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *
                                  )CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)),
              ((bVar2 ^ 0xffU) & 1) != 0) {
          std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::
          operator->((_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> *)
                     CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
          pVar4 = ::_GLOBAL__N_1::std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::
                  insert((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                         in_stack_ffffffffffffff18._M_node,
                         (value_type *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10)
                        );
          in_stack_ffffffffffffff18 = pVar4.first._M_node;
          in_stack_ffffffffffffff17 = pVar4.second;
          std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::
          operator++((_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> *)
                     CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        }
      }
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::set<uint256> CWallet::GetConflicts(const uint256& txid) const
{
    std::set<uint256> result;
    AssertLockHeld(cs_wallet);

    const auto it = mapWallet.find(txid);
    if (it == mapWallet.end())
        return result;
    const CWalletTx& wtx = it->second;

    std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range;

    for (const CTxIn& txin : wtx.tx->vin)
    {
        if (mapTxSpends.count(txin.prevout) <= 1)
            continue;  // No conflict if zero or one spends
        range = mapTxSpends.equal_range(txin.prevout);
        for (TxSpends::const_iterator _it = range.first; _it != range.second; ++_it)
            result.insert(_it->second);
    }
    return result;
}